

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

string * __thiscall Assimp::FIBase64ValueImpl::toString_abi_cxx11_(FIBase64ValueImpl *this)

{
  int iVar1;
  ostream *poVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  ostringstream os;
  string local_1c8;
  undefined7 uStack_1c7;
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->strValueValid == false) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    lVar5 = (long)(this->super_FIBase64Value).super_FIByteValue.value.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->super_FIBase64Value).super_FIByteValue.value.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar5 == 0) {
      iVar1 = 0;
      bVar4 = 0;
    }
    else {
      lVar6 = 0;
      iVar1 = 0;
      bVar3 = 0;
      do {
        bVar4 = (this->super_FIBase64Value).super_FIByteValue.value.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        if (iVar1 == 2) {
          local_1c8 = *(string *)
                       ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                       (ulong)(bVar4 >> 6) + (ulong)(bVar3 & 0xf) * 4);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)&local_1c8,1);
          local_1c8 = *(string *)
                       ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                       (bVar4 & 0x3f));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1c8,1);
          iVar1 = 0;
        }
        else if (iVar1 == 1) {
          local_1c8 = *(string *)
                       ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                       (byte)((bVar3 & 3) << 4 | bVar4 >> 4));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1c8,1);
          iVar1 = 2;
        }
        else {
          local_1c8 = *(string *)
                       ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                       (bVar4 >> 2));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1c8,1);
          iVar1 = 1;
        }
        lVar6 = lVar6 + 1;
        bVar3 = bVar4;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    if (iVar1 == 1) {
      local_1c8 = *(string *)
                   ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                   ((byte)(bVar4 << 4) & 0x30));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)&local_1c8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"==",2);
    }
    else if (iVar1 == 2) {
      local_1c8 = *(string *)
                   ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                   ((byte)(bVar4 << 2) & 0x3c));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)&local_1c8,1);
      local_1c8 = (string)0x3d;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1c8,1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->strValue,&local_1c8);
    if ((undefined1 *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1c7,local_1c8));
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            uint8_t c1 = 0, c2;
            int imod3 = 0;
            std::vector<uint8_t>::size_type valueSize = value.size();
            for (std::vector<uint8_t>::size_type i = 0; i < valueSize; ++i) {
                c2 = value[i];
                switch (imod3) {
                case 0:
                    os << basis_64[c2 >> 2];
                    imod3 = 1;
                    break;
                case 1:
                    os << basis_64[((c1 & 0x03) << 4) | ((c2 & 0xf0) >> 4)];
                    imod3 = 2;
                    break;
                case 2:
                    os << basis_64[((c1 & 0x0f) << 2) | ((c2 & 0xc0) >> 6)] << basis_64[c2 & 0x3f];
                    imod3 = 0;
                    break;
                }
                c1 = c2;
            }
            switch (imod3) {
            case 1:
                os << basis_64[(c1 & 0x03) << 4] << "==";
                break;
            case 2:
                os << basis_64[(c1 & 0x0f) << 2] << '=';
                break;
            }
            strValue = os.str();
        }
        return strValue;
    }